

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

bool pdqsort_detail::
     partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,ipx::Sortperm(int,double_const*,bool)::__1>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               anon_class_8_1_70098e60 comp)

{
  bool bVar1;
  reference piVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *this;
  difference_type dVar3;
  anon_class_8_1_70098e60 *in_RDX;
  T tmp;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> sift_1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> sift;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> cur;
  size_t limit;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_50;
  int local_44;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  ulong uVar4;
  
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (!bVar1) {
    uVar4 = 0;
    local_30 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator+((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)), bVar1)
    {
      local_38._M_current = local_30._M_current;
      local_40 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator-((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                           CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_38);
      in_stack_ffffffffffffffac = *piVar2;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                (&local_40);
      bVar1 = ipx::Sortperm::anon_class_8_1_70098e60::operator()
                        (in_RDX,(Int)(uVar4 >> 0x20),(Int)uVar4);
      if (bVar1) {
        piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_38);
        local_44 = *piVar2;
        do {
          piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_40);
          in_stack_ffffffffffffffa8 = *piVar2;
          local_50 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator--((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                                in_stack_ffffffffffffffa4);
          piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_50);
          *piVar2 = in_stack_ffffffffffffffa8;
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
          in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 & 0xffffff;
          if (bVar1) {
            in_stack_ffffffffffffffa0 = local_44;
            this = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator--(&local_40);
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                      (this);
            bVar1 = ipx::Sortperm::anon_class_8_1_70098e60::operator()
                              (in_RDX,(Int)(uVar4 >> 0x20),(Int)uVar4);
            in_stack_ffffffffffffffa4 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffa4);
          }
        } while ((char)(in_stack_ffffffffffffffa4 >> 0x18) != '\0');
        in_stack_ffffffffffffff9c = local_44;
        piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_38);
        *piVar2 = in_stack_ffffffffffffff9c;
        dVar3 = __gnu_cxx::operator-
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        uVar4 = dVar3 + uVar4;
      }
      if (8 < uVar4) {
        return false;
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_30);
    }
  }
  return true;
}

Assistant:

inline bool partial_insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return true;
        
        std::size_t limit = 0;
        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
                limit += cur - sift;
            }
            
            if (limit > partial_insertion_sort_limit) return false;
        }

        return true;
    }